

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::GetFileSize(PosixEnv *this,string *filename,uint64_t *size)

{
  int iVar1;
  int *piVar2;
  __off_t *in_RCX;
  stat file_stat;
  stat sStack_a8;
  
  iVar1 = stat((char *)*size,&sStack_a8);
  if (iVar1 == 0) {
    *in_RCX = sStack_a8.st_size;
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  else {
    *in_RCX = 0;
    piVar2 = __errno_location();
    PosixError((anon_unknown_1 *)this,(string *)size,*piVar2);
  }
  return (Status)(char *)this;
}

Assistant:

Status GetFileSize(const std::string& filename, uint64_t* size) override {
    struct ::stat file_stat;
    if (::stat(filename.c_str(), &file_stat) != 0) {
      *size = 0;
      return PosixError(filename, errno);
    }
    *size = file_stat.st_size;
    return Status::OK();
  }